

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O2

int __thiscall uWS::Group<false>::close(Group<false> *this,int __fd)

{
  int extraout_EAX;
  int iVar1;
  anon_class_24_3_b2829661 local_20;
  
  local_20.code = __fd;
  forEach<uWS::Group<false>::close(int,char*,unsigned_long)::_lambda(uWS::WebSocket<false>)_1_>
            (this,&local_20);
  stopListening(this);
  iVar1 = extraout_EAX;
  if (this->timer != (uv_timer_t *)0x0) {
    uv_timer_stop();
    iVar1 = uv_close(this->timer,close::anon_class_1_0_00000001::__invoke);
  }
  return iVar1;
}

Assistant:

void Group<isServer>::close(int code, char *message, size_t length) {
    forEach([code, message, length](uWS::WebSocket<isServer> ws) {
        ws.close(code, message, length);
    });
    stopListening();
    if (timer) {
        uv_timer_stop(timer);
        uv_close((uv_handle_t *) timer, [](uv_handle_t *handle) {
            delete (uv_timer_t *) handle;
        });
    }
}